

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_score.h
# Opt level: O0

void __thiscall xLearn::LinearScore::~LinearScore(LinearScore *this)

{
  void *in_RDI;
  
  ~LinearScore((LinearScore *)0x216cd8);
  operator_delete(in_RDI);
  return;
}

Assistant:

~LinearScore() { }